

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

void __thiscall ddd::DictionaryMLT<false,_true>::shrink(DictionaryMLT<false,_false> *this)

{
  bool bVar1;
  DaTrie<false,_true,_false> *pDVar2;
  long in_RDI;
  size_t i;
  DaTrie<false,_true,_false> *this_00;
  DaTrie<false,_true,_false> *local_10;
  
  local_10 = (DaTrie<false,_true,_false> *)0x0;
  while (this_00 = local_10,
        pDVar2 = (DaTrie<false,_true,_false> *)
                 std::
                 vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>
                 ::size((vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>
                         *)(in_RDI + 0x10)), this_00 < pDVar2) {
    std::
    vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>
    ::operator[]((vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>
                  *)(in_RDI + 0x10),(size_type)local_10);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                        *)0x1824bc);
    if (bVar1) {
      std::
      vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>
      ::operator[]((vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>
                    *)(in_RDI + 0x10),(size_type)local_10);
      std::
      unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                    *)0x1824dd);
      DaTrie<false,_true,_false>::shrink(this_00);
    }
    local_10 = (DaTrie<false,_true,_false> *)
               ((long)&(local_10->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl
                       .super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void shrink() {
    for (size_t i = 0; i < suffix_subtries_.size(); ++i) {
      if (suffix_subtries_[i]) {
        suffix_subtries_[i]->shrink();
      }
    }
  }